

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O1

TheoryElement * __thiscall Potassco::TheoryData::getElement(TheoryData *this,Id_t id)

{
  Data *pDVar1;
  ulong uVar2;
  
  uVar2 = (ulong)id;
  pDVar1 = this->data_;
  if ((id < (uint)((pDVar1->elems).top >> 3)) &&
     (*(long *)((long)(pDVar1->elems).mem.beg_ + uVar2 * 8) != 0)) {
    return *(TheoryElement **)((long)(pDVar1->elems).mem.beg_ + uVar2 * 8);
  }
  fail(-2,"const TheoryElement &Potassco::TheoryData::getElement(Id_t) const",0x149,"hasElement(id)"
       ,"Unknown element \'%u\'",uVar2,(ulong)pDVar1 & 0xffffffff00000000);
}

Assistant:

const TheoryElement& TheoryData::getElement(Id_t id) const {
	POTASSCO_REQUIRE(hasElement(id), "Unknown element '%u'", unsigned(id));
	return *elems()[id];
}